

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::erase
          (QGenericArrayOps<QDockAreaLayoutItem> *this,QDockAreaLayoutItem *b,qsizetype n)

{
  QDockAreaLayoutItem *pQVar1;
  QDockAreaLayoutItem *in_RDX;
  QDockAreaLayoutItem *in_RSI;
  long in_RDI;
  QDockAreaLayoutItem *end;
  QDockAreaLayoutItem *e;
  QDockAreaLayoutItem *in_stack_ffffffffffffffb8;
  QDockAreaLayoutItem *in_stack_ffffffffffffffc0;
  QDockAreaLayoutItem *__first;
  QDockAreaLayoutItem *other;
  
  __first = in_RSI + (long)in_RDX;
  pQVar1 = QArrayDataPointer<QDockAreaLayoutItem>::begin
                     ((QArrayDataPointer<QDockAreaLayoutItem> *)0x582363);
  other = __first;
  if ((in_RSI == pQVar1) &&
     (pQVar1 = QArrayDataPointer<QDockAreaLayoutItem>::end
                         ((QArrayDataPointer<QDockAreaLayoutItem> *)__first),
     in_stack_ffffffffffffffc0 = __first, __first != pQVar1)) {
    *(QDockAreaLayoutItem **)(in_RDI + 8) = other;
  }
  else {
    __first = in_stack_ffffffffffffffc0;
    pQVar1 = QArrayDataPointer<QDockAreaLayoutItem>::end
                       ((QArrayDataPointer<QDockAreaLayoutItem> *)__first);
    for (; other != pQVar1; other = other + 1) {
      QDockAreaLayoutItem::operator=(in_RDX,other);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - (long)in_RDX;
  std::destroy<QDockAreaLayoutItem*>(__first,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }